

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pStateChangeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_0::StateChangeCase::renderTest
          (StateChangeCase *this,Functions *gl)

{
  int local_1c;
  int callNdx;
  Functions *gl_local;
  StateChangeCase *this_local;
  
  for (local_1c = 0; local_1c < (this->super_StateChangePerformanceCase).m_callCount;
      local_1c = local_1c + 1) {
    (*(this->super_StateChangePerformanceCase).super_TestCase.super_TestNode._vptr_TestNode[8])
              (this,gl,0);
    deqp::gls::StateChangePerformanceCase::callDraw(&this->super_StateChangePerformanceCase,gl);
    (*(this->super_StateChangePerformanceCase).super_TestCase.super_TestNode._vptr_TestNode[8])
              (this,gl,1);
    deqp::gls::StateChangePerformanceCase::callDraw(&this->super_StateChangePerformanceCase,gl);
  }
  return;
}

Assistant:

void StateChangeCase::renderTest (const glw::Functions& gl)
{
	for (int callNdx = 0; callNdx < m_callCount; callNdx++)
	{
		changeState(gl, 0);
		callDraw(gl);

		changeState(gl, 1);
		callDraw(gl);
	}
}